

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall problem_parser::get_or_assign_variable(problem_parser *this,string_view value)

{
  string_view str;
  bool bVar1;
  type tVar2;
  pointer ppVar3;
  size_type sVar4;
  element_type *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>,_bool>
  pVar5;
  variable_type local_7c;
  int local_78 [2];
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_70;
  undefined1 local_68;
  problem_parser *local_60;
  size_t local_58;
  undefined1 local_50 [8];
  string_view string;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  _Stack_38;
  int size;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_30;
  iterator it;
  problem_parser *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (problem_parser *)value._M_len;
  it.
  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
             )(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
               )this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(&this->m_cache_variable,(key_type *)&this_local);
  _Stack_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(&this->m_cache_variable);
  bVar1 = std::__detail::operator==(&local_30,&stack0xffffffffffffffc8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    sVar4 = std::
            unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            ::size(&this->m_cache_variable);
    tVar2 = baryonyx::to_unsigned<int>(0x7fffffff);
    if (tVar2 < sVar4) {
      value_local._M_str._4_4_ = -1;
    }
    else {
      sVar4 = std::
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              ::size(&this->m_cache_variable);
      string._M_str._4_4_ = (int)sVar4;
      this_00 = std::
                __shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      local_60 = this_local;
      local_58 = value_local._M_len;
      str._M_str = (char *)value_local._M_len;
      str._M_len = (size_t)this_local;
      _local_50 = baryonyx::string_buffer::append(this_00,str);
      pVar5 = std::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
              ::try_emplace<int&>((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
                                   *)&this->m_cache_variable,(key_type *)local_50,
                                  (int *)((long)&string._M_str + 4));
      local_70._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
           ._M_cur;
      local_68 = pVar5.second;
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&(this->m_problem).vars,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_50);
      local_78[1] = 0;
      local_78[0] = std::numeric_limits<int>::max();
      local_7c = real;
      std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
      emplace_back<int,int,baryonyx::variable_type>
                ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>> *)
                 &(this->m_problem).vars.values,local_78 + 1,local_78,&local_7c);
      value_local._M_str._4_4_ = string._M_str._4_4_;
    }
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
                           *)&local_30);
    value_local._M_str._4_4_ = ppVar3->second;
  }
  return value_local._M_str._4_4_;
}

Assistant:

int get_or_assign_variable(const std::string_view value)
    {
        if (auto it = m_cache_variable.find(value);
            it != m_cache_variable.end())
            return it->second;

        if (m_cache_variable.size() > baryonyx::to_unsigned(INT_MAX))
            return -1;

        auto size = static_cast<int>(m_cache_variable.size());
        auto string = m_problem.strings->append(value);

        m_cache_variable.try_emplace(string, size);

        m_problem.vars.names.emplace_back(string);
        m_problem.vars.values.emplace_back(
          0, std::numeric_limits<int>::max(), baryonyx::variable_type::real);

        return size;
    }